

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadCompressedInts<unsigned_int>
          (CrateReader *this,uint *out,size_t num_ints)

{
  StreamReader *this_00;
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  size_t __new_size;
  uint64_t uVar4;
  char *pcVar5;
  ssize_t sVar6;
  size_t sVar7;
  unsigned_long *in_R8;
  undefined1 local_560 [3];
  bool ret;
  ostringstream local_540 [8];
  ostringstream ss_e_2;
  undefined1 local_3c8 [8];
  vector<char,_std::allocator<char>_> compBuffer;
  uint64_t compSize;
  ostringstream local_388 [8];
  ostringstream ss_e_1;
  size_t compBufferSize;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  undefined1 local_28 [8];
  size_t num_ints_local;
  uint *out_local;
  CrateReader *this_local;
  
  local_28 = (undefined1  [8])num_ints;
  num_ints_local = (size_t)out;
  out_local = (uint *)this;
  if ((this->_config).maxInts < num_ints) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadCompressedInts");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x12f);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1e0,"# of ints {} too large. maxInts is set to {}",&local_1e1);
    fmt::format<unsigned_long,unsigned_long>
              (&local_1c0,(fmt *)local_1e0,(string *)local_28,&(this->_config).maxInts,in_R8);
    poVar3 = ::std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string(local_1e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&compBufferSize);
    ::std::__cxx11::string::~string((string *)&compBufferSize);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  else {
    __new_size = Usd_IntegerCompression::GetCompressedBufferSize(num_ints);
    this->_memoryUsage = __new_size + this->_memoryUsage;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_388);
      poVar3 = ::std::operator<<((ostream *)local_388,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadCompressedInts");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x139);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_388,"Reached to max memory budget.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&compSize);
      ::std::__cxx11::string::~string((string *)&compSize);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_388);
    }
    else {
      bVar2 = StreamReader::read8(this->_sr,
                                  (uint64_t *)
                                  &compBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.field_0x10);
      if (bVar2) {
        if (__new_size <
            (ulong)compBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_) {
          compBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = __new_size;
        }
        uVar1 = compBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
        uVar4 = StreamReader::size(this->_sr);
        if (uVar4 < (ulong)uVar1) {
          this_local._7_1_ = 0;
        }
        else if ((ulong)compBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ <
                 4) {
          this_local._7_1_ = 0;
        }
        else {
          ::std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)local_3c8);
          ::std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)local_3c8,__new_size);
          uVar1 = compBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
          this_00 = this->_sr;
          pcVar5 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)local_3c8);
          sVar6 = StreamReader::read(this_00,(int)uVar1,(void *)uVar1,(size_t)pcVar5);
          if (sVar6 == 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_540);
            poVar3 = ::std::operator<<((ostream *)local_540,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,"[Crate]");
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ReadCompressedInts");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x153);
            ::std::operator<<(poVar3," ");
            poVar3 = ::std::operator<<((ostream *)local_540,"Failed to read compressedInts.");
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)local_560);
            ::std::__cxx11::string::~string((string *)local_560);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_540);
          }
          else {
            pcVar5 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)local_3c8);
            sVar7 = Usd_IntegerCompression::DecompressFromBuffer
                              (pcVar5,compBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl._16_8_,(uint32_t *)num_ints_local,(size_t)local_28,
                               &this->_err,(char *)0x0);
            this_local._7_1_ = sVar7 != 0;
            if (this->_memoryUsage < __new_size) {
              this->_memoryUsage = this->_memoryUsage - __new_size;
            }
          }
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_3c8);
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadCompressedInts(Int *out,
                                     size_t num_ints) {
  if (num_ints > _config.maxInts) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of ints {} too large. maxInts is set to {}", num_ints, _config.maxInts));
  }

  using Compressor =
      typename std::conditional<sizeof(Int) == 4, Usd_IntegerCompression,
                                Usd_IntegerCompression64>::type;


  // TODO: Read compressed data from _sr directly
  size_t compBufferSize = Compressor::GetCompressedBufferSize(num_ints);
  CHECK_MEMORY_USAGE(compBufferSize);

  uint64_t compSize;
  if (!_sr->read8(&compSize)) {
    return false;
  }

  if (compSize > compBufferSize) {
    // Truncate
    // TODO: return error?
    compSize = compBufferSize;
  }

  if (compSize > _sr->size()) {
    return false;
  }

  if (compSize < 4) {
    // Too small
    return false;
  }

  std::vector<char> compBuffer;
  compBuffer.resize(compBufferSize);
  if (!_sr->read(size_t(compSize), size_t(compSize),
                reinterpret_cast<uint8_t *>(compBuffer.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressedInts.");
  }

  bool ret = Compressor::DecompressFromBuffer(
      compBuffer.data(), size_t(compSize), out, num_ints, &_err);

  REDUCE_MEMORY_USAGE(compBufferSize);

  return ret;
}